

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O1

void __thiscall
CorUnix::CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
          (CSHRSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,
          SHMPTR shridObj)

{
  _USHRSynchCacheStackNode *p_Var1;
  
  if (shridObj != 0) {
    p_Var1 = (_USHRSynchCacheStackNode *)SHMPtrToPtr(shridObj);
    (p_Var1->pointers).shrid = shridObj;
    InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
    if ((this->m_iDepth).m_val < this->m_iMaxDepth) {
      (this->m_iDepth).m_val = (this->m_iDepth).m_val + 1;
      if (this->m_iMaxTrackedDepth < (this->m_iDepth).m_val) {
        this->m_iMaxTrackedDepth = (this->m_iDepth).m_val;
      }
      (p_Var1->pointers).pNext = (this->m_pHead).m_val;
      (this->m_pHead).m_val = p_Var1;
    }
    else {
      SHMfree(shridObj);
    }
    InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
    return;
  }
  return;
}

Assistant:

void Add(CPalThread * pthrCurrent, SharedID shridObj)
        {
            if (NULLSharedID == shridObj)
            {
                return;
            }

            USHRSynchCacheStackNode * pNode = SharedIDToTypePointer(USHRSynchCacheStackNode, shridObj);
            T * pObj = reinterpret_cast<T *>(pNode);

            pObj->~T();
            
            pNode->pointers.shrid = shridObj;
            
            Lock(pthrCurrent);
            if (m_iDepth < m_iMaxDepth)
            {
                m_iDepth++;
#ifdef _DEBUG
                if (m_iDepth > m_iMaxTrackedDepth)
                {
                    m_iMaxTrackedDepth = m_iDepth;
                }
#endif
                pNode->pointers.pNext = m_pHead;
                m_pHead = pNode;
            }
            else
            {
                RawSharedObjectFree(shridObj);
            }
            Unlock(pthrCurrent);       
        }